

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O0

int testStorageReaderTestsIncorrectDType(void)

{
  initializer_list<unsigned_short> __l;
  string *psVar1;
  ostream *poVar2;
  Span<unsigned_short,_18446744073709551615UL> SVar3;
  Span<unsigned_short,_18446744073709551615UL> data;
  runtime_error *ex;
  undefined1 local_138 [7];
  bool caughtCorrectException;
  StorageReader local_118;
  StorageReader reader;
  allocator<unsigned_short> local_e9;
  unsigned_short local_e8 [68];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> bytes;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile
            ((AutoDeleteTempFile *)
             &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_e8[0x38] = 0;
  local_e8[0x39] = 0;
  local_e8[0x3a] = 0;
  local_e8[0x3b] = 0;
  local_e8[0x3c] = 0;
  local_e8[0x3d] = 0;
  local_e8[0x3e] = 0;
  local_e8[0x3f] = 0;
  local_e8[0x30] = 0;
  local_e8[0x31] = 0;
  local_e8[0x32] = 0;
  local_e8[0x33] = 0;
  local_e8[0x34] = 0;
  local_e8[0x35] = 0;
  local_e8[0x36] = 0;
  local_e8[0x37] = 0;
  local_e8[0x28] = 0;
  local_e8[0x29] = 0;
  local_e8[0x2a] = 0;
  local_e8[0x2b] = 0;
  local_e8[0x2c] = 0;
  local_e8[0x2d] = 0;
  local_e8[0x2e] = 0;
  local_e8[0x2f] = 0;
  local_e8[0x20] = 0;
  local_e8[0x21] = 0;
  local_e8[0x22] = 0;
  local_e8[0x23] = 0;
  local_e8[0x24] = 0;
  local_e8[0x25] = 0;
  local_e8[0x26] = 0;
  local_e8[0x27] = 0;
  local_e8[0x18] = 0;
  local_e8[0x19] = 0;
  local_e8[0x1a] = 0;
  local_e8[0x1b] = 0;
  local_e8[0x1c] = 0;
  local_e8[0x1d] = 0;
  local_e8[0x1e] = 0;
  local_e8[0x1f] = 0;
  local_e8[0x10] = 0;
  local_e8[0x11] = 0;
  local_e8[0x12] = 0;
  local_e8[0x13] = 0;
  local_e8[0x14] = 0;
  local_e8[0x15] = 0;
  local_e8[0x16] = 0;
  local_e8[0x17] = 0;
  local_e8[8] = 0;
  local_e8[9] = 0;
  local_e8[10] = 0;
  local_e8[0xb] = 0;
  local_e8[0xc] = 0;
  local_e8[0xd] = 0;
  local_e8[0xe] = 0;
  local_e8[0xf] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[0x40] = 0;
  local_e8[0x41] = 0;
  local_e8[0x42] = 0;
  local_e8[0x43] = 0;
  memcpy(local_e8,&DAT_004c4202,0x88);
  local_58 = 0x44;
  local_60 = local_e8;
  std::allocator<unsigned_short>::allocator(&local_e9);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50,__l,&local_e9);
  std::allocator<unsigned_short>::~allocator(&local_e9);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)
                      &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  SVar3 = MILBlob::Util::MakeSpan<unsigned_short,_std::vector,_std::allocator<unsigned_short>_>
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  data.m_ptr = SVar3.m_size.m_size;
  reader.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl =
       (unique_ptr<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
        )SVar3.m_ptr;
  data.m_size.m_size =
       (size_t)reader.m_impl._M_t.
               super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
               .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,18446744073709551615ul>
            ((TestUtil *)psVar1,
             (string *)
             reader.m_impl._M_t.
             super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
             .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl,data);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)
                      &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_138,(string *)psVar1);
  MILBlob::Blob::StorageReader::StorageReader(&local_118,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  MILBlob::Blob::StorageReader::GetDataView<float>(&local_118,0x40);
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb1);
  std::operator<<(poVar2,": expected exception, but none thrown.\n");
  MILBlob::Blob::StorageReader::~StorageReader(&local_118);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile
            ((AutoDeleteTempFile *)
             &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int testStorageReaderTestsIncorrectDType()
{
    AutoDeleteTempFile tempfile;

    {
        // clang-format off
        std::vector<uint16_t> bytes {
            // HEADER
            0x0001, 0x0000, 0x0002, 0x0000,  // count=1, version=2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_0
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_1
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_3
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_4
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_5
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_6
            // METADATA
            0xBEEF, 0xDEAD, 0xFFFF, 0x0000,  // sentinel=0xDEADBEEF, mil_dtype=invalid
            0x0008, 0x0000, 0x0000, 0x0000,  // sizeInBytes=8 bytes
            0x0080, 0x0000, 0x0000, 0x0000,  // offset
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_0
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_1
            0x0001, 0x0000, 0x0000, 0x0000,  // reserved_2
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_3
            0x0000, 0x0000, 0x0000, 0x0000,  // reserved_4
            // DATA (8 bytes)
            0x0000, 0x0000, 0x0000, 0x0000
        };
        // clang-format on

        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(bytes));
    }

    StorageReader reader(tempfile.GetFilename());
    ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<float>(64),
                                  std::runtime_error,
                                  "Metadata data type does not match requested type.");

    return 0;
}